

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.cpp
# Opt level: O2

bool any_arg_contains(QList<FunctionDef> *functions,QByteArray *pattern)

{
  bool bVar1;
  ArgumentDef *arg;
  ArgumentDef *pAVar2;
  long lVar3;
  FunctionDef *f;
  FunctionDef *pFVar4;
  FunctionDef *pFVar5;
  QByteArrayView bv;
  
  pFVar4 = (functions->d).ptr;
  pFVar5 = pFVar4 + (functions->d).size;
  for (; pFVar4 != pFVar5; pFVar4 = pFVar4 + 1) {
    pAVar2 = (pFVar4->arguments).d.ptr;
    lVar3 = (pFVar4->arguments).d.size * 0xa8;
    while (lVar3 != 0) {
      bv.m_data = (pattern->d).ptr;
      bv.m_size = (pattern->d).size;
      bVar1 = QByteArray::contains(&pAVar2->normalizedType,bv);
      pAVar2 = pAVar2 + 1;
      lVar3 = lVar3 + -0xa8;
      if (bVar1) goto LAB_0011c3ce;
    }
  }
LAB_0011c3ce:
  return pFVar4 != pFVar5;
}

Assistant:

static bool any_arg_contains(const QList<FunctionDef> &functions, const QByteArray &pattern)
{
    for (const auto &f : functions) {
        for (const auto &arg : f.arguments) {
            if (arg.normalizedType.contains(pattern))
                return true;
        }
    }
    return false;
}